

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic_orix.cpp
# Opt level: O0

void mxv(Type *result,Type (*mx) [6000],Type *v)

{
  int j;
  int i;
  Type *v_local;
  Type (*mx_local) [6000];
  Type *result_local;
  
  for (i = 0; i < 0x5dc; i = i + 1) {
    result[i] = 0.0;
    for (j = 0; j < 6000; j = j + 1) {
      result[i] = mx[i][j] * v[j] + result[i];
    }
  }
  return;
}

Assistant:

void mxv(Type result[BCK], const Type mx[M/CHUNKS][N], const Type v[N])
{  
  for(int i = 0; i < BCK; i++) {
    result[i] = (Type)0;
    for(int j = 0; j < N; j++)
      result[i] += mx[i][j] * v[j];
  }
}